

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

string * __thiscall
soul::CodeLocation::getFilename_abi_cxx11_(string *__return_storage_ptr__,CodeLocation *this)

{
  SourceCodeText *pSVar1;
  pointer pcVar2;
  
  pSVar1 = (this->sourceCode).object;
  if (pSVar1 == (SourceCodeText *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pSVar1->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pSVar1->filename)._M_string_length)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocation::getFilename() const
{
    if (sourceCode != nullptr)
        return sourceCode->filename;

    return {};
}